

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  long lVar1;
  MessageGenerator *this_00;
  bool bVar2;
  OneofDescriptor *pOVar3;
  FieldOptions *this_01;
  char *pcVar4;
  reference pvVar5;
  Printer *printer;
  int __c;
  int local_20;
  int local_1c;
  int new_index;
  int has_bit_index;
  FieldDescriptor *field_local;
  LazySerializerEmitter *this_local;
  
  _new_index = field;
  field_local = (FieldDescriptor *)this;
  if (((*(byte *)((long)this + 0x40) & 1) != 0) ||
     (bVar2 = MustFlush(google::protobuf::FieldDescriptor_const__(this,field), bVar2)) {
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
              ((LazySerializerEmitter *)this);
  }
  pOVar3 = FieldDescriptor::real_containing_oneof(_new_index);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    this_01 = FieldDescriptor::options(_new_index);
    bVar2 = FieldOptions::weak(this_01);
    if (((!bVar2) && (bVar2 = FieldDescriptor::is_repeated(_new_index), !bVar2)) &&
       ((*(byte *)((long)this + 0x40) & 1) == 0)) {
      lVar1 = *this;
      pcVar4 = FieldDescriptor::index(_new_index,(char *)field,__c);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x158),(long)(int)pcVar4);
      local_1c = *pvVar5;
      if (*(int *)((long)this + 0x60) != local_1c / 0x20) {
        local_20 = local_1c / 0x20;
        Formatter::operator()
                  ((Formatter *)((long)this + 8),"cached_has_bits = _has_bits_[$1$];\n",&local_20);
        *(int *)((long)this + 0x60) = local_20;
      }
    }
    this_00 = *this;
    printer = Formatter::printer((Formatter *)((long)this + 8));
    GenerateSerializeOneField(this_00,printer,_new_index,*(int *)((long)this + 0x60));
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)this + 0x48),(value_type *)&new_index);
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (!field->real_containing_oneof()) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            format_("cached_has_bits = _has_bits_[$1$];\n", new_index);

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(format_.printer(), field,
                                       cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }